

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O0

void av1_calc_proj_params_avx2
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C,sgr_params_type *params)

{
  undefined4 in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_00000020;
  int in_stack_00000028;
  int64_t (*in_stack_00000030) [2];
  undefined4 in_stack_00000038;
  int in_stack_000001bc;
  uint8_t *in_stack_000001c0;
  int in_stack_000001cc;
  int in_stack_000001d0;
  int in_stack_000001d4;
  uint8_t *in_stack_000001d8;
  int in_stack_000003bc;
  uint8_t *in_stack_000003c0;
  int in_stack_000003cc;
  int in_stack_000003d0;
  int in_stack_000003d4;
  uint8_t *in_stack_000003d8;
  undefined4 in_stack_ffffffffffffff94;
  undefined8 in_stack_ffffffffffffffa0;
  int64_t *in_stack_ffffffffffffffa8;
  int64_t *in_stack_ffffffffffffffb8;
  
  if ((*(int *)CONCAT44(dat_stride,in_stack_00000038) < 1) ||
     (*(int *)(CONCAT44(dat_stride,in_stack_00000038) + 4) < 1)) {
    if (*(int *)CONCAT44(dat_stride,in_stack_00000038) < 1) {
      if (0 < *(int *)(CONCAT44(dat_stride,in_stack_00000038) + 4)) {
        calc_proj_params_r1_avx2
                  (in_stack_000001d8,in_stack_000001d4,in_stack_000001d0,in_stack_000001cc,
                   in_stack_000001c0,in_stack_000001bc,
                   (int32_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_00000020),
                   in_stack_00000028,in_stack_00000030,in_stack_ffffffffffffffa8);
      }
    }
    else {
      calc_proj_params_r0_avx2
                (in_stack_000001d8,in_stack_000001d4,in_stack_000001d0,in_stack_000001cc,
                 in_stack_000001c0,in_stack_000001bc,
                 (int32_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_00000010),in_stack_00000028,
                 in_stack_00000030,in_stack_ffffffffffffffa8);
    }
  }
  else {
    calc_proj_params_r0_r1_avx2
              (in_stack_000003d8,in_stack_000003d4,in_stack_000003d0,in_stack_000003cc,
               in_stack_000003c0,in_stack_000003bc,
               (int32_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_00000010),in_stack_00000018,
               (int32_t *)
               CONCAT44((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),in_stack_00000020),
               in_stack_00000028,in_stack_00000030,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void av1_calc_proj_params_avx2(const uint8_t *src8, int width, int height,
                               int src_stride, const uint8_t *dat8,
                               int dat_stride, int32_t *flt0, int flt0_stride,
                               int32_t *flt1, int flt1_stride, int64_t H[2][2],
                               int64_t C[2], const sgr_params_type *params) {
  if ((params->r[0] > 0) && (params->r[1] > 0)) {
    calc_proj_params_r0_r1_avx2(src8, width, height, src_stride, dat8,
                                dat_stride, flt0, flt0_stride, flt1,
                                flt1_stride, H, C);
  } else if (params->r[0] > 0) {
    calc_proj_params_r0_avx2(src8, width, height, src_stride, dat8, dat_stride,
                             flt0, flt0_stride, H, C);
  } else if (params->r[1] > 0) {
    calc_proj_params_r1_avx2(src8, width, height, src_stride, dat8, dat_stride,
                             flt1, flt1_stride, H, C);
  }
}